

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fspec.cc
# Opt level: O3

int4 __thiscall
ParamListStandard::characterizeAsParam(ParamListStandard *this,Address *loc,int4 size)

{
  pointer pprVar1;
  rangemap<ParamEntryRange> *this_00;
  ParamEntry *this_01;
  AddrSpace *pAVar2;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  int4 iVar5;
  const_iterator cVar6;
  const_iterator cVar7;
  ulong uVar8;
  int4 iVar9;
  pair<rangemap<ParamEntryRange>::PartIterator,_rangemap<ParamEntryRange>::PartIterator> pVar10;
  
  uVar8 = (ulong)loc->base->index;
  pprVar1 = (this->resolverMap).
            super__Vector_base<rangemap<ParamEntryRange>_*,_std::allocator<rangemap<ParamEntryRange>_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  iVar9 = 0;
  if ((uVar8 < (ulong)((long)(this->resolverMap).
                             super__Vector_base<rangemap<ParamEntryRange>_*,_std::allocator<rangemap<ParamEntryRange>_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pprVar1 >> 3)) &&
     (this_00 = pprVar1[uVar8], this_00 != (rangemap<ParamEntryRange> *)0x0)) {
    pVar10 = rangemap<ParamEntryRange>::find(this_00,loc->offset);
    cVar6._M_node = (_Base_ptr)pVar10.first.iter._M_node;
    if ((const_iterator)cVar6._M_node == pVar10.second.iter._M_node.iter) {
      iVar9 = 0;
    }
    else {
      iVar9 = 0;
      do {
        this_01 = (ParamEntry *)cVar6._M_node[2]._M_parent[1]._M_parent;
        if ((this_01->minsize <= size) &&
           (iVar5 = ParamEntry::justifiedContain(this_01,loc,size), iVar5 == 0)) {
          return 1;
        }
        if (this_01->spaceid == loc->base) {
          if ((loc->offset <= this_01->addressbase) &&
             ((this_01->addressbase + (long)this_01->size) - 1 <= loc->offset + (long)size + -1)) {
            iVar9 = 2;
          }
        }
        cVar6._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar6._M_node);
      } while ((const_iterator)cVar6._M_node != pVar10.second.iter._M_node.iter);
      if (iVar9 == 2) {
        return 2;
      }
    }
    if ((_Rb_tree_header *)cVar6._M_node != &(this_00->tree)._M_t._M_impl.super__Rb_tree_header) {
      cVar7 = rangemap<ParamEntryRange>::find_end(this_00,(loc->offset + (long)size) - 1);
      if ((const_iterator)cVar6._M_node != cVar7.iter._M_node) {
        pAVar2 = loc->base;
        p_Var3 = (_Base_ptr)loc->offset;
        do {
          p_Var4 = cVar6._M_node[2]._M_parent[1]._M_parent;
          if ((((AddrSpace *)p_Var4->_M_left == pAVar2) && (p_Var3 <= p_Var4->_M_right)) &&
             ((ulong)((long)p_Var4->_M_right + (long)(int)p_Var4[1]._M_color + -1) <=
              (ulong)((long)p_Var3 + (long)size + -1))) {
            return 2;
          }
          cVar6._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar6._M_node);
        } while ((const_iterator)cVar6._M_node != cVar7.iter._M_node);
      }
    }
  }
  return iVar9;
}

Assistant:

int4 ParamListStandard::characterizeAsParam(const Address &loc,int4 size) const

{
  int4 index = loc.getSpace()->getIndex();
  if (index >= resolverMap.size())
    return 0;
  ParamEntryResolver *resolver = resolverMap[index];
  if (resolver == (ParamEntryResolver *)0)
    return 0;
  pair<ParamEntryResolver::const_iterator,ParamEntryResolver::const_iterator> iterpair;
  iterpair = resolver->find(loc.getOffset());
  int4 res = 0;
  while(iterpair.first != iterpair.second) {
    const ParamEntry *testEntry = (*iterpair.first).getParamEntry();
    if (testEntry->getMinSize() <= size && testEntry->justifiedContain(loc, size)==0)
      return 1;
    if (testEntry->containedBy(loc, size))
      res = 2;
    ++iterpair.first;
  }
  if (res != 2 && iterpair.first != resolver->end()) {
    iterpair.second = resolver->find_end(loc.getOffset() + (size-1));
    while(iterpair.first != iterpair.second) {
      const ParamEntry *testEntry = (*iterpair.first).getParamEntry();
      if (testEntry->containedBy(loc, size)) {
	res = 2;
	break;
      }
      ++iterpair.first;
    }
  }
  return res;
}